

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qspinbox.cpp
# Opt level: O1

QVariant * __thiscall
QSpinBoxPrivate::calculateAdaptiveDecimalStep
          (QVariant *__return_storage_ptr__,QSpinBoxPrivate *this,int steps)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  double dVar4;
  
  uVar2 = ::QVariant::toInt((bool *)&(this->super_QAbstractSpinBoxPrivate).value);
  uVar1 = -uVar2;
  if (0 < (int)uVar2) {
    uVar1 = uVar2;
  }
  iVar3 = 1;
  if (99 < uVar1) {
    dVar4 = log10((double)(int)(((int)(uVar2 ^ steps) >> 0x1f) + uVar1));
    dVar4 = pow(10.0,(double)((int)dVar4 + -1));
    iVar3 = (int)dVar4;
  }
  ::QVariant::QVariant(__return_storage_ptr__,iVar3);
  return __return_storage_ptr__;
}

Assistant:

QVariant QSpinBoxPrivate::calculateAdaptiveDecimalStep(int steps) const
{
    const int intValue = value.toInt();
    const int absValue = qAbs(intValue);

    if (absValue < 100)
        return 1;

    const bool valueNegative = intValue < 0;
    const bool stepsNegative = steps < 0;
    const int signCompensation = (valueNegative == stepsNegative) ? 0 : 1;

    const int log = static_cast<int>(std::log10(absValue - signCompensation)) - 1;
    return static_cast<int>(std::pow(10, log));
}